

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_equal_rnd(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_datatype_t vVar2;
  vm_val_t *this_00;
  vm_val_t val2;
  vm_val_t local_38;
  
  if (getp_equal_rnd(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_equal_rnd();
  }
  this_00 = retval;
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_equal_rnd::desc);
  if (iVar1 == 0) {
    local_38.typ = sp_[-1].typ;
    local_38._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_38.val = sp_[-1].val;
    sp_ = sp_ + -1;
    iVar1 = cvt_to_bignum((CVmObjBigNum *)this_00,self,&local_38);
    if (iVar1 == 0) {
      vVar2 = VM_NIL;
    }
    else {
      iVar1 = compute_eq_round((this->super_CVmObject).ext_,
                               *(char **)((long)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]
                                                 [local_38.val.obj & 0xfff].ptr_ + 8));
      vVar2 = VM_TRUE - (iVar1 == 0);
    }
    retval->typ = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_equal_rnd(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the value to compare */
    G_stk->pop(&val2);

    /* convert it to BigNumber */
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* it's not a BigNumber, so it's not equal */
        retval->set_nil();
    }
    else
    {
        int ret;
        
        /* test for equality */
        ret = compute_eq_round(vmg_ ext_, get_objid_ext(vmg_ val2.val.obj));

        /* set the return value */
        retval->set_logical(ret);
    }

    /* handled */
    return TRUE;
}